

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

void __thiscall Fl_Table::draw(Fl_Table *this)

{
  byte bVar1;
  uint uVar2;
  Fl_Scroll *pFVar3;
  Fl_Scrollbar *pFVar4;
  Fl_Scrollbar *pFVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  
  iVar7 = Fl::scrollbar_size();
  if (((this->vscrollbar != (Fl_Scrollbar *)0x0) &&
      (iVar7 != (this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_)) ||
     ((this->hscrollbar != (Fl_Scrollbar *)0x0 &&
      (iVar7 != (this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_)))) {
    table_resized(this);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])
            (this,1,0,0,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,(ulong)(uint)this->tiw,
             (ulong)(uint)this->tih);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)this->wix,(ulong)(uint)this->wiy,(ulong)(uint)this->wiw
             ,(ulong)(uint)this->wih);
  Fl_Group::draw(&this->super_Fl_Group);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,
                      (this->super_Fl_Group).super_Fl_Widget.x_,
                      (this->super_Fl_Group).super_Fl_Widget.y_,
                      (this->super_Fl_Group).super_Fl_Widget.w_,
                      (this->super_Fl_Group).super_Fl_Widget.h_,
                      (this->super_Fl_Group).super_Fl_Widget.color_);
  pFVar3 = this->table;
  if ((((pFVar3->super_Fl_Group).super_Fl_Widget.flags_ & 2) != 0) &&
     (((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x81) != 0)) {
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(pFVar3->super_Fl_Group).super_Fl_Widget.box_,
                        this->tox,this->toy,this->tow,this->toh,
                        (pFVar3->super_Fl_Group).super_Fl_Widget.color_);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)this->wix,(ulong)(uint)this->wiy,(ulong)(uint)this->wiw
             ,(ulong)(uint)this->wih);
  if (-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) {
    if (this->_redraw_leftcol == -1) goto LAB_001cd5e0;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,
               (ulong)(uint)this->tiw,(ulong)(uint)this->tih);
    iVar13 = this->_redraw_rightcol;
    if (this->_redraw_leftcol <= iVar13) {
      iVar8 = this->_redraw_botrow;
      iVar12 = this->_redraw_leftcol;
      do {
        iVar10 = this->_redraw_toprow;
        if (this->_redraw_toprow <= iVar8) {
          do {
            _redraw_cell(this,CONTEXT_CELL,iVar10,iVar12);
            iVar8 = this->_redraw_botrow;
            bVar6 = iVar10 < iVar8;
            iVar10 = iVar10 + 1;
          } while (bVar6);
          iVar13 = this->_redraw_rightcol;
        }
        bVar6 = iVar12 < iVar13;
        iVar12 = iVar12 + 1;
      } while (bVar6);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    if (-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) goto LAB_001cd5e0;
  }
  if (this->_row_header != '\0') {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)this->wix,(ulong)(uint)this->toy,
               (ulong)(uint)this->_row_header_w,(ulong)(uint)this->toh);
    iVar13 = this->toprow;
    if (this->toprow <= this->botrow) {
      do {
        _redraw_cell(this,CONTEXT_ROW_HEADER,iVar13,0);
        bVar6 = iVar13 < this->botrow;
        iVar13 = iVar13 + 1;
      } while (bVar6);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  if (this->_col_header != '\0') {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)this->tox,(ulong)(uint)this->wiy,
               (ulong)(uint)this->tow,(ulong)(uint)this->_col_header_h);
    iVar13 = this->leftcol;
    if (this->leftcol <= this->rightcol) {
      do {
        _redraw_cell(this,CONTEXT_COL_HEADER,0,iVar13);
        bVar6 = iVar13 < this->rightcol;
        iVar13 = iVar13 + 1;
      } while (bVar6);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,(ulong)(uint)this->tiw
             ,(ulong)(uint)this->tih);
  iVar13 = this->botrow;
  if (this->toprow <= iVar13) {
    iVar8 = this->rightcol;
    iVar12 = this->toprow;
    do {
      iVar10 = this->leftcol;
      if (this->leftcol <= iVar8) {
        do {
          _redraw_cell(this,CONTEXT_CELL,iVar12,iVar10);
          iVar8 = this->rightcol;
          bVar6 = iVar10 < iVar8;
          iVar10 = iVar10 + 1;
        } while (bVar6);
        iVar13 = this->botrow;
      }
      bVar6 = iVar12 < iVar13;
      iVar12 = iVar12 + 1;
    } while (bVar6);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  if ((this->_row_header != '\0') && (this->_col_header != '\0')) {
    uVar14 = this->wix;
    uVar2 = this->wiy;
    uVar15 = this->_row_header_w;
    uVar9 = this->_col_header_h;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar14,(ulong)uVar2,(ulong)uVar15,(ulong)uVar9);
  }
  bVar1 = (this->table->super_Fl_Group).super_Fl_Widget.box_;
  if (bVar1 != 0) {
    if (this->_col_header != '\0') {
      uVar14 = this->tox;
      uVar2 = this->wiy;
      uVar9 = Fl::box_dx((uint)bVar1);
      uVar15 = this->_col_header_h;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar14,(ulong)uVar2,(ulong)uVar9,(ulong)uVar15);
    }
    if (this->_row_header != '\0') {
      uVar14 = this->wix;
      uVar2 = this->_row_header_w;
      uVar15 = this->toy;
      uVar9 = Fl::box_dx((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar14,(ulong)uVar15,(ulong)uVar2,(ulong)uVar9);
    }
  }
  iVar13 = this->table_w;
  uVar14 = this->tiw - iVar13;
  if (uVar14 != 0 && iVar13 <= this->tiw) {
    iVar8 = this->tix;
    uVar2 = this->tiy;
    uVar15 = this->tih;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)(iVar13 + iVar8),(ulong)uVar2,(ulong)uVar14,
               (ulong)uVar15);
    if (this->_col_header != '\0') {
      iVar13 = this->table_w;
      iVar8 = this->tiw;
      iVar12 = this->tix;
      uVar14 = this->wiy;
      iVar10 = Fl::box_dw((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
      iVar11 = Fl::box_dx((uint)(this->table->super_Fl_Group).super_Fl_Widget.box_);
      uVar2 = this->_col_header_h;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(uint)(iVar12 + iVar13),(ulong)uVar14,
                 (ulong)(uint)((iVar10 + iVar8) - (iVar11 + iVar13)),(ulong)uVar2);
    }
  }
  iVar13 = this->table_h;
  uVar14 = this->tih - iVar13;
  if (uVar14 != 0 && iVar13 <= this->tih) {
    iVar8 = this->tiy;
    uVar2 = this->tix;
    uVar15 = this->tiw;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar2,(ulong)(uint)(iVar13 + iVar8),(ulong)uVar15,
               (ulong)uVar14);
    if (this->_row_header != '\0') {
      uVar15 = this->table_h + this->tiy;
      uVar14 = this->wix;
      uVar2 = this->_row_header_w;
      iVar13 = this->wiy;
      iVar8 = 0;
      if (((this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
        iVar8 = iVar7;
      }
      iVar7 = this->wih;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar14,(ulong)uVar15,(ulong)uVar2,
                 (ulong)((iVar13 + iVar7) - (iVar8 + uVar15)));
    }
  }
LAB_001cd5e0:
  pFVar4 = this->vscrollbar;
  if ((((pFVar4->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (pFVar5 = this->hscrollbar,
     ((pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
    uVar14 = (pFVar4->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
    uVar2 = (pFVar4->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
    uVar15 = (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
    uVar9 = (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,(ulong)(this->super_Fl_Group).super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar14,(ulong)uVar15,(ulong)uVar2,(ulong)uVar9);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])
            (this,2,0,0,(ulong)(uint)this->tix,(ulong)(uint)this->tiy,(ulong)(uint)this->tiw,
             (ulong)(uint)this->tih);
  this->_redraw_toprow = -1;
  this->_redraw_botrow = -1;
  this->_redraw_leftcol = -1;
  this->_redraw_rightcol = -1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Table::draw() {   
#if FLTK_ABI_VERSION >= 10301
    // NEW
    int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
#else
    // OLD
    int scrollsize = Fl::scrollbar_size();
#endif
  // Check if scrollbar size changed
  if ( ( vscrollbar && (scrollsize != vscrollbar->w()) ) || 
       ( hscrollbar && (scrollsize != hscrollbar->h()) ) ) {
    // handle size change, min/max, table dim's, etc
    table_resized();
  }

  draw_cell(CONTEXT_STARTPAGE, 0, 0,	 	// let user's drawing routine
            tix, tiy, tiw, tih);		// prep new page
  
  // Let fltk widgets draw themselves first. Do this after
  // draw_cell(CONTEXT_STARTPAGE) in case user moves widgets around.
  // Use window 'inner' clip to prevent drawing into table border.
  // (unfortunately this clips FLTK's border, so we must draw it explicity below)
  //
  fl_push_clip(wix, wiy, wiw, wih);
  {
    Fl_Group::draw();
  }
  fl_pop_clip();
  
  // Explicitly draw border around widget, if any
  draw_box(box(), x(), y(), w(), h(), color());
  
  // If Fl_Scroll 'table' is hidden, draw its box
  //    Do this after Fl_Group::draw() so we draw over scrollbars
  //    that leak around the border.
  //
  if ( ! table->visible() ) {
    if ( damage() & FL_DAMAGE_ALL || damage() & FL_DAMAGE_CHILD ) {
      draw_box(table->box(), tox, toy, tow, toh, table->color());
    }
  } 
  // Clip all further drawing to the inner widget dimensions
  fl_push_clip(wix, wiy, wiw, wih);
  {
    // Only redraw a few cells?
    if ( ! ( damage() & FL_DAMAGE_ALL ) && _redraw_leftcol != -1 ) {
      fl_push_clip(tix, tiy, tiw, tih);
      for ( int c = _redraw_leftcol; c <= _redraw_rightcol; c++ ) {
        for ( int r = _redraw_toprow; r <= _redraw_botrow; r++ ) { 
          _redraw_cell(CONTEXT_CELL, r, c);
        }
      }
      fl_pop_clip();
    }
    if ( damage() & FL_DAMAGE_ALL ) {
      int X,Y,W,H;
      // Draw row headers, if any
      if ( row_header() ) {
        get_bounds(CONTEXT_ROW_HEADER, X, Y, W, H);
        fl_push_clip(X,Y,W,H);
        for ( int r = toprow; r <= botrow; r++ ) {
          _redraw_cell(CONTEXT_ROW_HEADER, r, 0);
        }
        fl_pop_clip();
      }
      // Draw column headers, if any
      if ( col_header() ) {
        get_bounds(CONTEXT_COL_HEADER, X, Y, W, H);
        fl_push_clip(X,Y,W,H);
        for ( int c = leftcol; c <= rightcol; c++ ) {
          _redraw_cell(CONTEXT_COL_HEADER, 0, c);
        }
        fl_pop_clip();
      } 
      // Draw all cells.
      //    This includes cells partially obscured off edges of table.
      //    No longer do this last; you might think it would be nice
      //    to draw over dead zones, but on redraws it flickers. Avoid
      //    drawing over deadzones; prevent deadzones by sizing columns.
      //
      fl_push_clip(tix, tiy, tiw, tih); {
        for ( int r = toprow; r <= botrow; r++ ) {
          for ( int c = leftcol; c <= rightcol; c++ ) {
            _redraw_cell(CONTEXT_CELL, r, c); 
          }
        }
      }
      fl_pop_clip(); 
      // Draw little rectangle in corner of headers
      if ( row_header() && col_header() ) {
        fl_rectf(wix, wiy, row_header_width(), col_header_height(), color());
      }
      
      // Table has a boxtype? Close those few dead pixels
      if ( table->box() ) {
        if ( col_header() ) {
          fl_rectf(tox, wiy, Fl::box_dx(table->box()), col_header_height(), color());
        }
        if ( row_header() ) {
          fl_rectf(wix, toy, row_header_width(), Fl::box_dx(table->box()), color());
        }
      }
      
      // Table width smaller than window? Fill remainder with rectangle
      if ( table_w < tiw ) {
        fl_rectf(tix + table_w, tiy, tiw - table_w, tih, color()); 
        // Col header? fill that too
        if ( col_header() ) {
          fl_rectf(tix + table_w, 
                   wiy, 
                   // get that corner just right..
                   (tiw - table_w + Fl::box_dw(table->box()) - 
                    Fl::box_dx(table->box())),
                   col_header_height(),
                   color());
        }
      } 
      // Table height smaller than window? Fill remainder with rectangle
      if ( table_h < tih ) {
        fl_rectf(tix, tiy + table_h, tiw, tih - table_h, color()); 
        if ( row_header() ) {
          // NOTE:
          //     Careful with that lower corner; don't use tih; when eg.
          //     table->box(FL_THIN_UP_FRAME) and hscrollbar hidden,
          //     leaves a row of dead pixels.
          //
          fl_rectf(wix, tiy + table_h, row_header_width(), 
                   (wiy+wih) - (tiy+table_h) - 
                   ( hscrollbar->visible() ? scrollsize : 0),
                   color());
        }
      }
    } 
    // Both scrollbars? Draw little box in lower right
    if ( vscrollbar->visible() && hscrollbar->visible() ) {
      fl_rectf(vscrollbar->x(), hscrollbar->y(), 
               vscrollbar->w(), hscrollbar->h(), color());
    } 
    draw_cell(CONTEXT_ENDPAGE, 0, 0,		// let user's drawing
              tix, tiy, tiw, tih);		// routines cleanup
    
    _redraw_leftcol = _redraw_rightcol = _redraw_toprow = _redraw_botrow = -1;
  }
  fl_pop_clip();
}